

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void compute_coherence_metrics<sparse_parameters>(lda *l,sparse_parameters *weights)

{
  uint64_t uVar1;
  initializer_list<word_doc_frequency> __l;
  bool bVar2;
  size_t sVar3;
  float *pfVar4;
  char *pcVar5;
  size_type sVar6;
  const_reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  size_type sVar10;
  key_type *pkVar11;
  reference pvVar12;
  anon_class_8_1_3fcf654a_for__M_pred __pred;
  pointer pwVar13;
  int __c;
  int __c_00;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> *__s;
  ulong *in_RDI;
  float fVar14;
  iterator iVar15;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_vector<word_doc_frequency>_>_>::value,_pair<iterator,_bool>_>
  _Var16;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  co_feature_df;
  mapped_type *co_feature;
  uint64_t f2_1;
  uint64_t f1_1;
  feature_pair *pairs;
  iterator __end2_2;
  iterator __begin2_2;
  value_type *__range2_2;
  float coherence;
  size_t topic_1;
  float avg_coherence;
  float epsilon;
  size_t j_1;
  size_t i_3;
  value_type *examples_for_f2;
  word_doc_frequency *wdf_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *__range2_1;
  value_type *examples_for_f1;
  pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  *pair;
  iterator __end1_1;
  iterator __begin1_1;
  map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  *__range1_1;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> vec_1;
  iterator wdf;
  uint64_t f2;
  uint64_t f1;
  feature_pair *wp;
  iterator __end2;
  iterator __begin2;
  vector<feature_pair,_std::allocator<feature_pair>_> *__range2;
  vector<feature_pair,_std::allocator<feature_pair>_> *vec;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  *__range1;
  map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  coWordsDFSet;
  size_t j;
  size_t i_2;
  value_type *word_pairs;
  int i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> top_features_idx;
  iterator v;
  uint64_t i;
  iterator iter;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
  top_features;
  anon_class_1_0_00000001 cmp;
  size_t topic;
  int top_words_count;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  topics_word_pairs;
  uint64_t length;
  sparse_iterator<float> *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  in_stack_fffffffffffffb80;
  anon_class_8_1_3fcf654a_for__M_pred in_stack_fffffffffffffb88;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  in_stack_fffffffffffffb90;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  in_stack_fffffffffffffb98;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
  *in_stack_fffffffffffffba0;
  ulong uVar17;
  key_type *in_stack_fffffffffffffba8;
  undefined6 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb6;
  undefined1 in_stack_fffffffffffffbb7;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  local_348;
  mapped_type *local_340;
  uint64_t local_338;
  size_type local_330;
  reference local_328;
  feature_pair *local_320;
  __normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
  local_318;
  reference local_310;
  float local_304;
  ulong local_300;
  float local_2f8;
  float local_2f4;
  ulong local_2f0;
  key_type *local_2e8;
  reference local_2e0;
  reference local_2d8;
  word_doc_frequency *local_2d0;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  local_2c8;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *local_2c0;
  reference local_2b8;
  reference local_2b0;
  _Self local_2a8;
  _Self local_2a0;
  undefined1 *local_298;
  _Base_ptr local_290;
  undefined1 local_288;
  uint64_t local_258;
  undefined4 local_250;
  uint64_t *local_248;
  undefined8 local_240;
  uint64_t local_220;
  undefined4 local_218;
  word_doc_frequency *local_210;
  uint64_t *local_208;
  word_doc_frequency *local_200;
  word_doc_frequency *local_1f8;
  word_doc_frequency *local_1f0;
  _Self local_1e8;
  _Self local_1e0;
  uint64_t local_1d8;
  uint64_t local_1d0;
  reference local_1c8;
  feature_pair *local_1c0;
  __normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
  local_1b8;
  reference local_1b0;
  reference local_1a8;
  vector<feature_pair,_std::allocator<feature_pair>_> *local_1a0;
  __normal_iterator<std::vector<feature_pair,_std::allocator<feature_pair>_>_*,_std::vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>_>
  local_198;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  *local_190;
  undefined1 local_188 [48];
  feature_pair local_158;
  ulong local_148;
  ulong local_140;
  reference local_138;
  int local_12c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  feature local_110;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_100;
  uint32_t local_f8;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_f0;
  uint32_t local_e8;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_e0;
  uint32_t local_d8;
  sparse_iterator<float> local_d0;
  feature local_c0;
  ulong local_b0;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_a8;
  uint32_t local_a0;
  sparse_iterator<float> local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  ulong local_48;
  int local_40;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  local_30;
  char *local_18;
  ulong *local_8;
  
  local_18 = (char *)(1L << (*(byte *)(in_RDI[0x31] + 0x50) & 0x3f));
  local_8 = in_RDI;
  std::
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ::vector((vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
            *)0x21ad7e);
  std::
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ::resize((vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
            *)in_stack_fffffffffffffb90._M_current,(size_type)in_stack_fffffffffffffb88.f2);
  local_40 = 10;
  for (local_48 = 0; local_48 < *local_8; local_48 = local_48 + 1) {
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    std::vector<feature,_std::allocator<feature>_>::vector
              ((vector<feature,_std::allocator<feature>_> *)0x21adf4);
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
    ::priority_queue(in_stack_fffffffffffffba0,
                     (anon_class_1_0_00000001 *)in_stack_fffffffffffffb98._M_current,
                     (vector<feature,_std::allocator<feature>_> *)
                     in_stack_fffffffffffffb90._M_current);
    std::vector<feature,_std::allocator<feature>_>::~vector
              ((vector<feature,_std::allocator<feature>_> *)in_stack_fffffffffffffb80._M_current);
    iVar15 = sparse_parameters::begin
                       ((sparse_parameters *)
                        CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    local_a8._M_cur =
         (__node_type *)
         iVar15._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_a0 = iVar15._stride;
    local_b0 = 0;
    local_98._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_a8._M_cur;
    local_98._stride = local_a0;
    while (uVar17 = local_b0, pcVar5 = local_18, sVar3 = min((long)local_40,(size_t)local_18),
          uVar17 < sVar3) {
      pfVar4 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x21aed4);
      fVar14 = pfVar4[local_48];
      pcVar5 = sparse_iterator<float>::index(&local_98,pcVar5,__c);
      feature::feature(&local_c0,fVar14,(uint64_t)pcVar5);
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
      ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
              *)in_stack_fffffffffffffb90._M_current,(value_type *)in_stack_fffffffffffffb88.f2);
      local_b0 = local_b0 + 1;
      sparse_iterator<float>::operator++
                ((sparse_iterator<float> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    }
    iVar15 = sparse_parameters::begin
                       ((sparse_parameters *)
                        CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    local_e0._M_cur =
         (__node_type *)
         iVar15._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_d8 = iVar15._stride;
    local_d0._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_e0._M_cur;
    local_d0._stride = local_d8;
    while( true ) {
      iVar15 = sparse_parameters::end
                         ((sparse_parameters *)
                          CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      local_100._M_cur =
           (__node_type *)
           iVar15._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_f8 = iVar15._stride;
      __s = &local_f0;
      local_f0._M_cur = local_100._M_cur;
      local_e8 = local_f8;
      bVar2 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)
                         CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                         in_stack_fffffffffffffb68);
      if (!bVar2) break;
      pfVar4 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x21b098);
      fVar14 = pfVar4[local_48];
      pvVar7 = std::
               priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
               ::top((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                      *)0x21b0bb);
      if (pvVar7->x <= fVar14 && fVar14 != pvVar7->x) {
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
               *)in_stack_fffffffffffffb80._M_current);
        pfVar4 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x21b0ff);
        fVar14 = pfVar4[local_48];
        pcVar5 = sparse_iterator<float>::index(&local_d0,(char *)__s,__c_00);
        feature::feature(&local_110,fVar14,(uint64_t)pcVar5);
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                *)in_stack_fffffffffffffb90._M_current,(value_type *)in_stack_fffffffffffffb88.f2);
      }
      sparse_iterator<float>::operator++
                ((sparse_iterator<float> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x21b177);
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
    ::size((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
            *)0x21b184);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffb90._M_current,(size_type)in_stack_fffffffffffffb88.f2);
    sVar6 = std::
            priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
            ::size((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                    *)0x21b1b2);
    local_12c = (int)sVar6;
    while (local_12c = local_12c + -1, -1 < local_12c) {
      pvVar7 = std::
               priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
               ::top((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                      *)0x21b1e9);
      uVar1 = pvVar7->weight_index;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_128,(long)local_12c);
      *pvVar8 = uVar1;
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
      ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
             *)in_stack_fffffffffffffb80._M_current);
    }
    local_138 = std::
                vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                ::operator[](&local_30,local_48);
    for (local_140 = 0; uVar17 = local_140,
        sVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_128),
        sVar10 = local_140, uVar17 < sVar9; local_140 = local_140 + 1) {
      while( true ) {
        local_148 = sVar10 + 1;
        uVar17 = local_148;
        sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_128);
        if (sVar10 <= uVar17) break;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_128,local_140);
        uVar1 = *pvVar8;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_128,local_148);
        feature_pair::feature_pair(&local_158,uVar1,*pvVar8);
        std::vector<feature_pair,_std::allocator<feature_pair>_>::push_back
                  ((vector<feature_pair,_std::allocator<feature_pair>_> *)
                   CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   (value_type *)in_stack_fffffffffffffb68);
        sVar10 = local_148;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffb80._M_current);
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
    ::~priority_queue((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                       *)0x21b3d8);
  }
  std::
  map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  ::map((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
         *)0x21b410);
  local_190 = &local_30;
  local_198._M_current =
       (vector<feature_pair,_std::allocator<feature_pair>_> *)
       std::
       vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
       ::begin((vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                *)in_stack_fffffffffffffb68);
  local_1a0 = (vector<feature_pair,_std::allocator<feature_pair>_> *)
              std::
              vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
              ::end((vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                     *)in_stack_fffffffffffffb68);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<feature_pair,_std::allocator<feature_pair>_>_*,_std::vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                            (__normal_iterator<std::vector<feature_pair,_std::allocator<feature_pair>_>_*,_std::vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>_>
                             *)in_stack_fffffffffffffb68), bVar2) {
    local_1b0 = __gnu_cxx::
                __normal_iterator<std::vector<feature_pair,_std::allocator<feature_pair>_>_*,_std::vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>_>
                ::operator*(&local_198);
    local_1a8 = local_1b0;
    local_1b8._M_current =
         (feature_pair *)
         std::vector<feature_pair,_std::allocator<feature_pair>_>::begin
                   ((vector<feature_pair,_std::allocator<feature_pair>_> *)in_stack_fffffffffffffb68
                   );
    local_1c0 = (feature_pair *)
                std::vector<feature_pair,_std::allocator<feature_pair>_>::end
                          ((vector<feature_pair,_std::allocator<feature_pair>_> *)
                           in_stack_fffffffffffffb68);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                              (__normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
                               *)in_stack_fffffffffffffb68), bVar2) {
      local_1c8 = __gnu_cxx::
                  __normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
                  ::operator*(&local_1b8);
      local_1d0 = local_1c8->f1;
      local_1d8 = local_1c8->f2;
      local_1e0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
           ::find((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                   *)in_stack_fffffffffffffb68,(key_type *)0x21b526);
      local_1e8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
           ::end((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                  *)in_stack_fffffffffffffb68);
      bVar2 = std::operator!=(&local_1e0,&local_1e8);
      if (bVar2) {
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        local_1f8 = (word_doc_frequency *)
                    std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::begin
                              ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                               in_stack_fffffffffffffb68);
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        local_200 = (word_doc_frequency *)
                    std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::end
                              ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                               in_stack_fffffffffffffb68);
        local_208 = &local_1d8;
        local_1f0 = (word_doc_frequency *)
                    std::
                    find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,compute_coherence_metrics<sparse_parameters>(lda&,sparse_parameters&)::_lambda(word_doc_frequency_const&)_1_>
                              (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                               in_stack_fffffffffffffb88);
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        local_210 = (word_doc_frequency *)
                    std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::end
                              ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                               in_stack_fffffffffffffb68);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                            *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                           (__normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                            *)in_stack_fffffffffffffb68);
        if (bVar2) {
          std::
          _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
          local_220 = local_1d8;
          local_218 = 0;
          std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::push_back
                    ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                     CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                     (value_type *)in_stack_fffffffffffffb68);
        }
      }
      else {
        local_258 = local_1d8;
        local_250 = 0;
        local_248 = &local_258;
        local_240 = 1;
        std::allocator<word_doc_frequency>::allocator((allocator<word_doc_frequency> *)0x21b6d5);
        __l._M_len._0_6_ = in_stack_fffffffffffffbb0;
        __l._M_array = (iterator)in_stack_fffffffffffffba8;
        __l._M_len._6_1_ = in_stack_fffffffffffffbb6;
        __l._M_len._7_1_ = in_stack_fffffffffffffbb7;
        std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::vector
                  ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   in_stack_fffffffffffffba0,__l,
                   (allocator_type *)in_stack_fffffffffffffb98._M_current);
        std::allocator<word_doc_frequency>::~allocator((allocator<word_doc_frequency> *)0x21b706);
        std::
        make_pair<unsigned_long&,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>&>
                  ((unsigned_long *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                   (vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        _Var16 = std::
                 map<unsigned_long,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>>
                 ::
                 insert<std::pair<unsigned_long,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>
                           ((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                             *)in_stack_fffffffffffffb80._M_current,
                            (pair<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        local_290 = (_Base_ptr)_Var16.first._M_node;
        in_stack_fffffffffffffbb7 = _Var16.second;
        local_288 = in_stack_fffffffffffffbb7;
        std::
        pair<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>::
        ~pair((pair<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
               *)0x21b76a);
        std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::~vector
                  ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   in_stack_fffffffffffffb80._M_current);
      }
      __gnu_cxx::
      __normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>::
      operator++(&local_1b8);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<feature_pair,_std::allocator<feature_pair>_>_*,_std::vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>_>
    ::operator++(&local_198);
  }
  local_298 = local_188;
  local_2a0._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
       ::begin((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                *)in_stack_fffffffffffffb68);
  local_2a8._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
       ::end((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
              *)in_stack_fffffffffffffb68);
  while (bVar2 = std::operator!=(&local_2a0,&local_2a8), bVar2) {
    local_2b0 = std::
                _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                             *)0x21b875);
    local_2b8 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              *)(local_8 + 0x2c),local_2b0->first);
    local_2c0 = &local_2b0->second;
    local_2c8._M_current =
         (word_doc_frequency *)
         std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::begin
                   ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                    in_stack_fffffffffffffb68);
    local_2d0 = (word_doc_frequency *)
                std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::end
                          ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                           in_stack_fffffffffffffb68);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                              (__normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                               *)in_stack_fffffffffffffb68), bVar2) {
      local_2d8 = __gnu_cxx::
                  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                  ::operator*(&local_2c8);
      local_2e0 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                *)(local_8 + 0x2c),local_2d8->idx);
      local_2e8 = (key_type *)0x0;
      local_2f0 = 0;
      while( true ) {
        in_stack_fffffffffffffba8 = local_2e8;
        pkVar11 = (key_type *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_2b8);
        in_stack_fffffffffffffbb6 = false;
        if (in_stack_fffffffffffffba8 < pkVar11) {
          uVar17 = local_2f0;
          sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_2e0);
          in_stack_fffffffffffffbb6 = uVar17 < sVar10;
        }
        if ((bool)in_stack_fffffffffffffbb6 == false) break;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_2b8,(size_type)local_2e8);
        in_stack_fffffffffffffb98._M_current = (word_doc_frequency *)*pvVar8;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_2e0,local_2f0);
        if (in_stack_fffffffffffffb98._M_current == (word_doc_frequency *)*pvVar8) {
          local_2d8->count = local_2d8->count + 1;
          local_2e8 = (key_type *)((long)local_2e8 + 1);
          local_2f0 = local_2f0 + 1;
        }
        else {
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (local_2e0,local_2f0);
          in_stack_fffffffffffffb90._M_current = (word_doc_frequency *)*pvVar8;
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (local_2b8,(size_type)local_2e8);
          if (in_stack_fffffffffffffb90._M_current < (word_doc_frequency *)*pvVar8) {
            local_2f0 = local_2f0 + 1;
          }
          else {
            local_2e8 = (key_type *)((long)local_2e8 + 1);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
      ::operator++(&local_2c8);
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  }
  local_2f4 = 1e-06;
  local_2f8 = 0.0;
  for (local_300 = 0; local_300 < *local_8; local_300 = local_300 + 1) {
    local_304 = 0.0;
    local_310 = std::
                vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                ::operator[](&local_30,local_300);
    local_318._M_current =
         (feature_pair *)
         std::vector<feature_pair,_std::allocator<feature_pair>_>::begin
                   ((vector<feature_pair,_std::allocator<feature_pair>_> *)in_stack_fffffffffffffb68
                   );
    local_320 = (feature_pair *)
                std::vector<feature_pair,_std::allocator<feature_pair>_>::end
                          ((vector<feature_pair,_std::allocator<feature_pair>_> *)
                           in_stack_fffffffffffffb68);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                              (__normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
                               *)in_stack_fffffffffffffb68), bVar2) {
      local_328 = __gnu_cxx::
                  __normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>
                  ::operator*(&local_318);
      local_330 = local_328->f1;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_8 + 0x29),
                           local_330);
      if (*pvVar12 != 0) {
        local_338 = local_328->f2;
        __pred.f2 = (uint64_t *)
                    std::
                    map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                    ::operator[]((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffbb7,
                                             CONCAT16(in_stack_fffffffffffffbb6,
                                                      in_stack_fffffffffffffbb0)),
                                 in_stack_fffffffffffffba8);
        local_340 = (mapped_type *)__pred.f2;
        std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::begin
                  ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   in_stack_fffffffffffffb68);
        std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::end
                  ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   in_stack_fffffffffffffb68);
        in_stack_fffffffffffffb80 =
             std::
             find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,compute_coherence_metrics<sparse_parameters>(lda&,sparse_parameters&)::_lambda(word_doc_frequency_const&)_2_>
                       (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,__pred);
        local_348 = in_stack_fffffffffffffb80;
        std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::end
                  ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                   in_stack_fffffffffffffb68);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                            *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                           (__normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                            *)in_stack_fffffffffffffb68);
        if (bVar2) {
          pwVar13 = __gnu_cxx::
                    __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
                    ::operator->(&local_348);
          fVar14 = (float)pwVar13->count + local_2f4;
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               (local_8 + 0x29),local_330);
          fVar14 = logf(fVar14 / (float)*pvVar12);
          local_304 = fVar14 + local_304;
        }
      }
      __gnu_cxx::
      __normal_iterator<feature_pair_*,_std::vector<feature_pair,_std::allocator<feature_pair>_>_>::
      operator++(&local_318);
    }
    printf("Topic %3d coherence: %f\n",SUB84((double)local_304,0),local_300 & 0xffffffff);
    local_2f8 = local_304 + local_2f8;
  }
  local_2f8 = local_2f8 / (float)*local_8;
  printf("Avg topic coherence: %f\n",SUB84((double)local_2f8,0));
  std::
  map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  ::~map((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
          *)0x21be07);
  std::
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ::~vector((vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
             *)in_stack_fffffffffffffb80._M_current);
  return;
}

Assistant:

void compute_coherence_metrics(lda &l, T &weights)
{
  uint64_t length = (uint64_t)1 << l.all->num_bits;

  std::vector<std::vector<feature_pair>> topics_word_pairs;
  topics_word_pairs.resize(l.topics);

  int top_words_count = 10;  // parameterize and check

  for (size_t topic = 0; topic < l.topics; topic++)
  {
    // get top features for this topic
    auto cmp = [](feature &left, feature &right) { return left.x > right.x; };
    std::priority_queue<feature, std::vector<feature>, decltype(cmp)> top_features(cmp);
    typename T::iterator iter = weights.begin();
    for (uint64_t i = 0; i < min(top_words_count, length); i++, ++iter)
      top_features.push(feature((&(*iter))[topic], iter.index()));

    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if ((&(*v))[topic] > top_features.top().x)
      {
        top_features.pop();
        top_features.push(feature((&(*v))[topic], v.index()));
      }

    // extract idx and sort descending
    vector<uint64_t> top_features_idx;
    top_features_idx.resize(top_features.size());
    for (int i = (int)top_features.size() - 1; i >= 0; i--)
    {
      top_features_idx[i] = top_features.top().weight_index;
      top_features.pop();
    }

    auto &word_pairs = topics_word_pairs[topic];
    for (size_t i = 0; i < top_features_idx.size(); i++)
      for (size_t j = i + 1; j < top_features_idx.size(); j++)
        word_pairs.push_back(feature_pair(top_features_idx[i], top_features_idx[j]));
  }

  // compress word pairs and create record for storing frequency
  std::map<uint64_t, std::vector<word_doc_frequency>> coWordsDFSet;
  for (auto &vec : topics_word_pairs)
  {
    for (auto &wp : vec)
    {
      auto f1 = wp.f1;
      auto f2 = wp.f2;
      auto wdf = coWordsDFSet.find(f1);

      if (wdf != coWordsDFSet.end())
      {
        // http://stackoverflow.com/questions/5377434/does-stdmapiterator-return-a-copy-of-value-or-a-value-itself
        // if (wdf->second.find(f2) == wdf->second.end())

        if (std::find_if(wdf->second.begin(), wdf->second.end(),
                [&f2](const word_doc_frequency &v) { return v.idx == f2; }) != wdf->second.end())
        {
          wdf->second.push_back({f2, 0});
          // printf(" add %d %d\n", f1, f2);
        }
      }
      else
      {
        std::vector<word_doc_frequency> vec = {{f2, 0}};
        coWordsDFSet.insert(std::make_pair(f1, vec));
        // printf(" insert %d %d\n", f1, f2);
      }
    }
  }

  // this.GetWordPairsDocumentFrequency(coWordsDFSet);
  for (auto &pair : coWordsDFSet)
  {
    auto &examples_for_f1 = l.feature_to_example_map[pair.first];
    for (auto &wdf : pair.second)
    {
      auto &examples_for_f2 = l.feature_to_example_map[wdf.idx];

      // assumes examples_for_f1 and examples_for_f2 are orderd
      size_t i = 0;
      size_t j = 0;
      while (i < examples_for_f1.size() && j < examples_for_f2.size())
      {
        if (examples_for_f1[i] == examples_for_f2[j])
        {
          wdf.count++;
          i++;
          j++;
        }
        else if (examples_for_f2[j] < examples_for_f1[i])
          j++;
        else
          i++;
      }
    }
  }

  float epsilon = 1e-6f;  // TODO
  float avg_coherence = 0;
  for (size_t topic = 0; topic < l.topics; topic++)
  {
    float coherence = 0;

    for (auto &pairs : topics_word_pairs[topic])
    {
      auto f1 = pairs.f1;
      if (l.feature_counts[f1] == 0)
        continue;

      auto f2 = pairs.f2;
      auto &co_feature = coWordsDFSet[f1];
      auto co_feature_df = std::find_if(
          co_feature.begin(), co_feature.end(), [&f2](const word_doc_frequency &v) { return v.idx == f2; });

      if (co_feature_df != co_feature.end())
      {
        // printf("(%d:%d + eps)/(%d:%d)\n", f2, co_feature_df->count, f1, l.feature_counts[f1]);
        coherence += logf((co_feature_df->count + epsilon) / l.feature_counts[f1]);
      }
    }

    printf("Topic %3d coherence: %f\n", (int)topic, coherence);

    // TODO: expose per topic coherence

    // TODO: good vs. bad topics
    avg_coherence += coherence;
  }

  avg_coherence /= l.topics;

  printf("Avg topic coherence: %f\n", avg_coherence);
}